

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
FastVector<x86Instruction,_true,_true>::grow_no_destroy
          (FastVector<x86Instruction,_true,_true> *this,uint newSize)

{
  x86Instruction *dst;
  x86Instruction *newData;
  uint newSize_local;
  FastVector<x86Instruction,_true,_true> *this_local;
  
  if (newSize < this->max + (this->max >> 1)) {
    newData._4_4_ = this->max + (this->max >> 1);
  }
  else {
    newData._4_4_ = newSize + 0x20;
  }
  dst = (x86Instruction *)NULLC::alignedAlloc(newData._4_4_ * 0x50);
  if (dst != (x86Instruction *)0x0) {
    NULLC::fillMemory(dst,0,(ulong)newData._4_4_ * 0x50);
    if (this->data != (x86Instruction *)0x0) {
      NULLC::copyMemory(dst,this->data,(ulong)this->max * 0x50);
    }
    this->data = dst;
    this->max = newData._4_4_;
    return;
  }
  __assert_fail("newData",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0xa7,
                "void FastVector<x86Instruction, true, true>::grow_no_destroy(unsigned int) [T = x86Instruction, zeroNewMemory = true, skipConstructor = true]"
               );
}

Assistant:

void grow_no_destroy(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 32;

		T* newData;

		if(!skipConstructor)
			newData = NULLC::construct<T>(newSize);
		else
			newData = (T*)NULLC::alignedAlloc(sizeof(T) * newSize);

		assert(newData);

		if(zeroNewMemory)
			NULLC::fillMemory(newData, 0, newSize * sizeof(T));

		if(data)
			NULLC::copyMemory(newData, data, max * sizeof(T));

		data = newData;
		max = newSize;
	}